

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Scaler::Scaler(Scaler *this,Scaler *from)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Scaler_00404648;
  google::protobuf::RepeatedField<double>::RepeatedField(&this->shiftvalue_,&from->shiftvalue_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->scalevalue_,&from->scalevalue_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

Scaler::Scaler(const Scaler& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      shiftvalue_(from.shiftvalue_),
      scalevalue_(from.scalevalue_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Scaler)
}